

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

void parse_rockridge_NM1(file_info *file,uchar *data,int data_length)

{
  int data_length_local;
  uchar *data_local;
  file_info *file_local;
  
  if (file->name_continues == '\0') {
    (file->name).length = 0;
  }
  file->name_continues = '\0';
  if (0 < data_length) {
    switch(*data) {
    case '\0':
      if (1 < data_length) {
        archive_strncat(&file->name,data + 1,(long)(data_length + -1));
      }
      break;
    case '\x01':
      if (1 < data_length) {
        archive_strncat(&file->name,data + 1,(long)(data_length + -1));
        file->name_continues = '\x01';
      }
      break;
    case '\x02':
      archive_strcat(&file->name,".");
      break;
    default:
      break;
    case '\x04':
      archive_strcat(&file->name,"..");
    }
  }
  return;
}

Assistant:

static void
parse_rockridge_NM1(struct file_info *file,
		    const unsigned char *data, int data_length)
{
	if (!file->name_continues)
		archive_string_empty(&file->name);
	file->name_continues = 0;
	if (data_length < 1)
		return;
	/*
	 * NM version 1 extension comprises:
	 *   1 byte flag, value is one of:
	 *     = 0: remainder is name
	 *     = 1: remainder is name, next NM entry continues name
	 *     = 2: "."
	 *     = 4: ".."
	 *     = 32: Implementation specific
	 *     All other values are reserved.
	 */
	switch(data[0]) {
	case 0:
		if (data_length < 2)
			return;
		archive_strncat(&file->name,
		    (const char *)data + 1, data_length - 1);
		break;
	case 1:
		if (data_length < 2)
			return;
		archive_strncat(&file->name,
		    (const char *)data + 1, data_length - 1);
		file->name_continues = 1;
		break;
	case 2:
		archive_strcat(&file->name, ".");
		break;
	case 4:
		archive_strcat(&file->name, "..");
		break;
	default:
		return;
	}

}